

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  uint32 uVar1;
  int iVar2;
  uint uVar3;
  ScriptContext *this;
  SnapArrayBufferInfo *pSVar4;
  JavascriptLibrary *this_00;
  ArrayBuffer *pAVar5;
  undefined4 extraout_var;
  ArrayBuffer *abuff;
  SnapArrayBufferInfo *buffInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar4 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
                     (snpObject);
  this_00 = Js::ScriptContext::GetLibrary(this);
  pAVar5 = Js::JavascriptLibrary::CreateArrayBuffer(this_00,pSVar4->Length);
  uVar1 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    ();
  if (uVar1 != pSVar4->Length) {
    TTDAbort_unrecoverable_error("Something is wrong with our sizes.");
  }
  iVar2 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])
                    ();
  uVar3 = (*(pAVar5->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    ();
  js_memcpy_s((void *)CONCAT44(extraout_var,iVar2),(ulong)uVar3,pSVar4->Buff,(ulong)pSVar4->Length);
  return (RecyclableObject *)pAVar5;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapArrayBufferInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //ArrayBuffers can change on us so seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapArrayBufferInfo* buffInfo = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(snpObject);

            Js::ArrayBuffer* abuff = ctx->GetLibrary()->CreateArrayBuffer(buffInfo->Length);
            TTDAssert(abuff->GetByteLength() == buffInfo->Length, "Something is wrong with our sizes.");

            js_memcpy_s(abuff->GetBuffer(), abuff->GetByteLength(), buffInfo->Buff, buffInfo->Length);

            return abuff;
        }